

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

N_Vector ManyVectorClone(N_Vector w,int cloneempty)

{
  N_Vector p_Var1;
  long *plVar2;
  void *pvVar3;
  undefined8 uVar4;
  int in_ESI;
  long *in_RDI;
  sunindextype i;
  N_VectorContent_ManyVector content;
  N_Vector v;
  SUNContext_conflict sunctx_local_scope_;
  long local_30;
  
  p_Var1 = (N_Vector)N_VNewEmpty(in_RDI[2]);
  N_VCopyOps(in_RDI,p_Var1);
  plVar2 = (long *)malloc(0x20);
  p_Var1->content = plVar2;
  *plVar2 = *(long *)*in_RDI;
  plVar2[1] = *(long *)(*in_RDI + 8);
  *(undefined4 *)(plVar2 + 3) = 1;
  plVar2[2] = 0;
  pvVar3 = malloc(*plVar2 << 3);
  plVar2[2] = (long)pvVar3;
  for (local_30 = 0; local_30 < *plVar2; local_30 = local_30 + 1) {
    *(undefined8 *)(plVar2[2] + local_30 * 8) = 0;
  }
  for (local_30 = 0; local_30 < *plVar2; local_30 = local_30 + 1) {
    if (in_ESI == 0) {
      uVar4 = N_VClone(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_30 * 8));
      *(undefined8 *)(plVar2[2] + local_30 * 8) = uVar4;
    }
    else {
      uVar4 = N_VCloneEmpty(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_30 * 8));
      *(undefined8 *)(plVar2[2] + local_30 * 8) = uVar4;
    }
  }
  return p_Var1;
}

Assistant:

static N_Vector ManyVectorClone(N_Vector w, sunbooleantype cloneempty)
{
  SUNFunctionBegin(w->sunctx);
  N_Vector v;
  MVAPPEND(N_VectorContent) content;
  sunindextype i;

  /* Create vector */
  v = NULL;
  v = N_VNewEmpty(w->sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  SUNCheckCallNull(N_VCopyOps(w, v));

  /* Create content */
  content = NULL;
  content = (MVAPPEND(N_VectorContent))malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content and ops to new vector, and return */
  v->content = content;

  /* Attach content components */

  /* Set scalar components */
#ifdef MANYVECTOR_BUILD_WITH_MPI
  content->comm = MPI_COMM_NULL;
#endif
  content->num_subvectors = MANYVECTOR_NUM_SUBVECS(w);
  content->global_length  = MANYVECTOR_GLOBLENGTH(w);
  content->own_data       = SUNTRUE;

  /* Allocate the subvector array */
  content->subvec_array = NULL;
  content->subvec_array =
    (N_Vector*)malloc(content->num_subvectors * sizeof(N_Vector));
  SUNAssertNull(content->subvec_array, SUN_ERR_MALLOC_FAIL);

  /* Initialize the subvector array to NULL */
  for (i = 0; i < content->num_subvectors; i++)
  {
    content->subvec_array[i] = NULL;
  }

  /* Duplicate the input communicator (if applicable) */
#ifdef MANYVECTOR_BUILD_WITH_MPI
  if (MANYVECTOR_COMM(w) != MPI_COMM_NULL)
  {
    SUNCheckMPICallNull(MPI_Comm_dup(MANYVECTOR_COMM(w), &(content->comm)));
  }
#endif

  /* Clone vectors into the subvector array */
  for (i = 0; i < content->num_subvectors; i++)
  {
    if (cloneempty)
    {
      content->subvec_array[i] = N_VCloneEmpty(MANYVECTOR_SUBVEC(w, i));
      SUNCheckLastErrNull();
    }
    else
    {
      content->subvec_array[i] = N_VClone(MANYVECTOR_SUBVEC(w, i));
      SUNCheckLastErrNull();
    }
  }

  return (v);
}